

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.cc
# Opt level: O0

void scryptROMix(block_t *B,uint64_t r,uint64_t N,block_t *T,block_t *V)

{
  uint uVar1;
  ulong local_50;
  size_t k;
  ulong uStack_40;
  uint32_t j;
  uint64_t i_1;
  uint64_t i;
  block_t *V_local;
  block_t *T_local;
  uint64_t N_local;
  uint64_t r_local;
  block_t *B_local;
  
  OPENSSL_memcpy(V,B,r << 7);
  for (i_1 = 1; i_1 < N; i_1 = i_1 + 1) {
    scryptBlockMix(V + r * 2 * i_1,V + r * 2 * (i_1 - 1),r);
  }
  scryptBlockMix(B,V + r * 2 * (N - 1),r);
  for (uStack_40 = 0; uStack_40 < N; uStack_40 = uStack_40 + 1) {
    uVar1 = B[r * 2 + -1].words[0];
    for (local_50 = 0; local_50 < r << 1; local_50 = local_50 + 1) {
      xor_block(T + local_50,B + local_50,V + r * 2 * (ulong)(uVar1 & (int)N - 1U) + local_50);
    }
    scryptBlockMix(B,T,r);
  }
  return;
}

Assistant:

static void scryptROMix(block_t *B, uint64_t r, uint64_t N, block_t *T,
                        block_t *V) {
  // Steps 1 and 2.
  OPENSSL_memcpy(V, B, 2 * r * sizeof(block_t));
  for (uint64_t i = 1; i < N; i++) {
    scryptBlockMix(&V[2 * r * i /* scrypt block i */],
                   &V[2 * r * (i - 1) /* scrypt block i-1 */], r);
  }
  scryptBlockMix(B, &V[2 * r * (N - 1) /* scrypt block N-1 */], r);

  // Step 3.
  for (uint64_t i = 0; i < N; i++) {
    // Note this assumes |N| <= 2^32 and is a power of 2.
    uint32_t j = B[2 * r - 1].words[0] & (N - 1);
    for (size_t k = 0; k < 2 * r; k++) {
      xor_block(&T[k], &B[k], &V[2 * r * j + k]);
    }
    scryptBlockMix(B, T, r);
  }
}